

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializer.cpp
# Opt level: O0

int __thiscall jbcoin::SerialIter::getVLDataLength(SerialIter *this)

{
  byte bVar1;
  byte bVar2;
  uint b1_00;
  int iVar3;
  int b3;
  int b2_1;
  int b2;
  int lenLen;
  int datLen;
  int b1;
  SerialIter *this_local;
  
  bVar1 = get8(this);
  b1_00 = (uint)bVar1;
  iVar3 = Serializer::decodeLengthLength(b1_00);
  if (iVar3 == 1) {
    b2 = Serializer::decodeVLLength(b1_00);
  }
  else if (iVar3 == 2) {
    bVar1 = get8(this);
    b2 = Serializer::decodeVLLength(b1_00,(uint)bVar1);
  }
  else {
    if (iVar3 != 3) {
      __assert_fail("lenLen == 3",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/trongnmchainos[P]validator-keys-tool/extras/jbcoin-libpp/extras/jbcoind/src/jbcoin/protocol/impl/Serializer.cpp"
                    ,0x228,"int jbcoin::SerialIter::getVLDataLength()");
    }
    bVar1 = get8(this);
    bVar2 = get8(this);
    b2 = Serializer::decodeVLLength(b1_00,(uint)bVar1,(uint)bVar2);
  }
  return b2;
}

Assistant:

int SerialIter::getVLDataLength ()
{
    int b1 = get8();
    int datLen;
    int lenLen = Serializer::decodeLengthLength(b1);
    if (lenLen == 1)
    {
        datLen = Serializer::decodeVLLength (b1);
    }
    else if (lenLen == 2)
    {
        int b2 = get8();
        datLen = Serializer::decodeVLLength (b1, b2);
    }
    else
    {
        assert(lenLen == 3);
        int b2 = get8();
        int b3 = get8();
        datLen = Serializer::decodeVLLength (b1, b2, b3);
    }
    return datLen;
}